

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O0

void DES_ede3_cbc_encrypt_ex
               (uint8_t *in,uint8_t *out,size_t len,DES_key_schedule *ks1,DES_key_schedule *ks2,
               DES_key_schedule *ks3,uint8_t *ivec,int enc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *puVar5;
  size_t sVar6;
  uint *puVar7;
  undefined1 *puVar8;
  uint32_t t1;
  uint32_t t0;
  uint8_t *iv;
  uint32_t tin [2];
  uint32_t xor1;
  uint32_t xor0;
  uint32_t tout1;
  uint32_t tout0;
  uint32_t tin1;
  uint32_t tin0;
  DES_key_schedule *ks3_local;
  DES_key_schedule *ks2_local;
  DES_key_schedule *ks1_local;
  size_t len_local;
  uint8_t *out_local;
  uint8_t *in_local;
  
  ks1_local = (DES_key_schedule *)len;
  len_local = (size_t)out;
  out_local = in;
  if (enc == 0) {
    tin[0] = *(uint32_t *)(ivec + 4);
    tin[1] = *(uint32_t *)ivec;
    for (; (DES_key_schedule *)0x7 < ks1_local;
        ks1_local = (DES_key_schedule *)(ks1_local[-1].subkeys + 0xf)) {
      puVar7 = (uint *)(out_local + 4);
      uVar1 = *(uint *)out_local;
      out_local = out_local + 8;
      uVar2 = *puVar7;
      iv._0_4_ = uVar1;
      iv._4_4_ = uVar2;
      DES_decrypt3((uint *)&iv,(DES_key_schedule *)ks1,(DES_key_schedule *)ks2,
                   (DES_key_schedule *)ks3);
      uVar3 = tin[1] ^ (uint)iv;
      uVar4 = tin[0] ^ iv._4_4_;
      *(char *)len_local = (char)uVar3;
      *(char *)(len_local + 1) = (char)(uVar3 >> 8);
      *(char *)(len_local + 2) = (char)(uVar3 >> 0x10);
      *(char *)(len_local + 3) = (char)(uVar3 >> 0x18);
      *(char *)(len_local + 4) = (char)uVar4;
      *(char *)(len_local + 5) = (char)(uVar4 >> 8);
      puVar8 = (undefined1 *)(len_local + 7);
      *(char *)(len_local + 6) = (char)(uVar4 >> 0x10);
      len_local = len_local + 8;
      *puVar8 = (char)(uVar4 >> 0x18);
      tin[0] = uVar2;
      tin[1] = uVar1;
    }
    if (ks1_local != (DES_key_schedule *)0x0) {
      uVar1 = *(uint *)out_local;
      uVar2 = *(uint *)(out_local + 4);
      iv._0_4_ = uVar1;
      iv._4_4_ = uVar2;
      DES_decrypt3((uint *)&iv,(DES_key_schedule *)ks1,(DES_key_schedule *)ks2,
                   (DES_key_schedule *)ks3);
      uVar3 = tin[1] ^ (uint)iv;
      uVar4 = tin[0] ^ iv._4_4_;
      sVar6 = (long)ks1_local->subkeys[0] + len_local;
      tin[0] = uVar2;
      tin[1] = uVar1;
      len_local = sVar6;
      switch(ks1_local) {
      case (DES_key_schedule *)0x8:
        len_local = sVar6 - 1;
        *(char *)(sVar6 - 1) = (char)(uVar4 >> 0x18);
      case (DES_key_schedule *)0x7:
        *(char *)(len_local - 1) = (char)(uVar4 >> 0x10);
        len_local = len_local - 1;
      case (DES_key_schedule *)0x6:
        *(char *)(len_local - 1) = (char)(uVar4 >> 8);
        len_local = len_local - 1;
      case (DES_key_schedule *)0x5:
        *(char *)(len_local - 1) = (char)uVar4;
        len_local = len_local - 1;
      case (DES_key_schedule *)0x4:
        *(char *)(len_local - 1) = (char)(uVar3 >> 0x18);
        len_local = len_local - 1;
      case (DES_key_schedule *)0x3:
        *(char *)(len_local - 1) = (char)(uVar3 >> 0x10);
        len_local = len_local - 1;
      case (DES_key_schedule *)0x2:
        *(char *)(len_local - 1) = (char)(uVar3 >> 8);
        len_local = len_local - 1;
      case (DES_key_schedule *)0x1:
        *(char *)(len_local - 1) = (char)uVar3;
      }
    }
    *ivec = (uint8_t)tin[1];
    ivec[1] = (uint8_t)(tin[1] >> 8);
    ivec[2] = (uint8_t)(tin[1] >> 0x10);
    ivec[3] = (uint8_t)(tin[1] >> 0x18);
    ivec[4] = (uint8_t)tin[0];
    ivec[5] = (uint8_t)(tin[0] >> 8);
    ivec[6] = (uint8_t)(tin[0] >> 0x10);
    ivec[7] = (uint8_t)(tin[0] >> 0x18);
  }
  else {
    xor0 = *(uint32_t *)ivec;
    xor1 = *(uint32_t *)(ivec + 4);
    for (; (DES_key_schedule *)0x7 < ks1_local;
        ks1_local = (DES_key_schedule *)(ks1_local[-1].subkeys + 0xf)) {
      puVar7 = (uint *)(out_local + 4);
      uVar1 = *(uint *)out_local;
      out_local = out_local + 8;
      iv._0_4_ = xor0 ^ uVar1;
      iv._4_4_ = xor1 ^ *puVar7;
      DES_encrypt3((uint *)&iv,(DES_key_schedule *)ks1,(DES_key_schedule *)ks2,
                   (DES_key_schedule *)ks3);
      xor0 = (uint)iv;
      xor1 = iv._4_4_;
      *(char *)len_local = (char)(uint)iv;
      *(char *)(len_local + 1) = (char)((uint)iv >> 8);
      *(char *)(len_local + 2) = (char)((uint)iv >> 0x10);
      *(char *)(len_local + 3) = (char)((uint)iv >> 0x18);
      *(char *)(len_local + 4) = (char)iv._4_4_;
      *(char *)(len_local + 5) = (char)(iv._4_4_ >> 8);
      puVar8 = (undefined1 *)(len_local + 7);
      *(char *)(len_local + 6) = (char)(iv._4_4_ >> 0x10);
      len_local = len_local + 8;
      *puVar8 = (char)(iv._4_4_ >> 0x18);
    }
    if (ks1_local != (DES_key_schedule *)0x0) {
      puVar5 = out_local + (long)ks1_local;
      tout1 = 0;
      tout0 = 0;
      out_local = puVar5;
      switch(ks1_local) {
      case (DES_key_schedule *)0x8:
        out_local = puVar5 + -1;
        tout1 = (uint)puVar5[-1] << 0x18;
      case (DES_key_schedule *)0x7:
        tout1 = (uint)out_local[-1] << 0x10 | tout1;
        out_local = out_local + -1;
      case (DES_key_schedule *)0x6:
        tout1 = (uint)out_local[-1] << 8 | tout1;
        out_local = out_local + -1;
      case (DES_key_schedule *)0x5:
        tout1 = out_local[-1] | tout1;
        out_local = out_local + -1;
      case (DES_key_schedule *)0x4:
        tout0 = (uint)out_local[-1] << 0x18;
        out_local = out_local + -1;
      case (DES_key_schedule *)0x3:
        tout0 = (uint)out_local[-1] << 0x10 | tout0;
        out_local = out_local + -1;
      case (DES_key_schedule *)0x2:
        tout0 = (uint)out_local[-1] << 8 | tout0;
        out_local = out_local + -1;
      case (DES_key_schedule *)0x1:
        tout0 = out_local[-1] | tout0;
      default:
        iv._0_4_ = xor0 ^ tout0;
        iv._4_4_ = xor1 ^ tout1;
        DES_encrypt3((uint *)&iv,(DES_key_schedule *)ks1,(DES_key_schedule *)ks2,
                     (DES_key_schedule *)ks3);
        xor0 = (uint)iv;
        xor1 = iv._4_4_;
        *(char *)len_local = (char)(uint)iv;
        *(char *)(len_local + 1) = (char)((uint)iv >> 8);
        *(char *)(len_local + 2) = (char)((uint)iv >> 0x10);
        *(char *)(len_local + 3) = (char)((uint)iv >> 0x18);
        *(char *)(len_local + 4) = (char)iv._4_4_;
        *(char *)(len_local + 5) = (char)(iv._4_4_ >> 8);
        *(char *)(len_local + 6) = (char)(iv._4_4_ >> 0x10);
        *(char *)(len_local + 7) = (char)(iv._4_4_ >> 0x18);
      }
    }
    *ivec = (uint8_t)xor0;
    ivec[1] = (uint8_t)(xor0 >> 8);
    ivec[2] = (uint8_t)(xor0 >> 0x10);
    ivec[3] = (uint8_t)(xor0 >> 0x18);
    ivec[4] = (uint8_t)xor1;
    ivec[5] = (uint8_t)(xor1 >> 8);
    ivec[6] = (uint8_t)(xor1 >> 0x10);
    ivec[7] = (uint8_t)(xor1 >> 0x18);
  }
  return;
}

Assistant:

void DES_ede3_cbc_encrypt_ex(const uint8_t *in, uint8_t *out, size_t len,
                             const DES_key_schedule *ks1,
                             const DES_key_schedule *ks2,
                             const DES_key_schedule *ks3, uint8_t ivec[8],
                             int enc) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  uint32_t tin[2];
  uint8_t *iv;

  iv = ivec;

  if (enc) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin1 ^= tout1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_encrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      l2c(tout0, out);
      l2c(tout1, out);
    }
    if (len != 0) {
      c2ln(in, tin0, tin1, len);
      tin0 ^= tout0;
      tin1 ^= tout1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_encrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      l2c(tout0, out);
      l2c(tout1, out);
    }
    iv = ivec;
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    uint32_t t0, t1;

    c2l(iv, xor0);
    c2l(iv, xor1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);

      t0 = tin0;
      t1 = tin1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_decrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      tout0 ^= xor0;
      tout1 ^= xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = t0;
      xor1 = t1;
    }
    if (len != 0) {
      c2l(in, tin0);
      c2l(in, tin1);

      t0 = tin0;
      t1 = tin1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_decrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      tout0 ^= xor0;
      tout1 ^= xor1;
      l2cn(tout0, tout1, out, len);
      xor0 = t0;
      xor1 = t1;
    }

    iv = ivec;
    l2c(xor0, iv);
    l2c(xor1, iv);
  }

  tin[0] = tin[1] = 0;
}